

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *localGenerators)

{
  _Rb_tree_header *p_Var1;
  pointer ppcVar2;
  cmMakefile *this_00;
  pointer ppcVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  char *pcVar10;
  bool *in_R8;
  pointer ppcVar11;
  pointer ppcVar12;
  bool bVar13;
  bool rccIsValid;
  bool uicIsValid;
  bool mocIsValid;
  bool globalAutoRccTarget;
  bool globalAutoGenTarget;
  cmGeneratorTarget *target;
  allocator<char> local_161;
  string targetName;
  cmLocalGenerator *localGen;
  string uicExec;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_100;
  string version;
  string msg;
  string rccExec;
  string comp;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CompilerFeatures_)._M_h._M_buckets = &(this->CompilerFeatures_)._M_h._M_single_bucket;
  (this->CompilerFeatures_)._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_)._M_h._M_element_count = 0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Keywords::Keywords(&this->Keywords_);
  ppcVar11 = (localGenerators->
             super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar2 = (localGenerators->
            super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  while( true ) {
    if (ppcVar11 == ppcVar2) break;
    localGen = *ppcVar11;
    globalAutoGenTarget = false;
    globalAutoRccTarget = false;
    this_00 = localGen->Makefile;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET",(allocator<char> *)&uicExec);
    psVar9 = cmMakefile::GetSafeDefinition(this_00,&targetName);
    bVar4 = cmSystemTools::IsOn(psVar9);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uicExec,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME",(allocator<char> *)&rccExec);
      psVar9 = cmMakefile::GetSafeDefinition(this_00,&uicExec);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar9);
      std::__cxx11::string::~string((string *)&uicExec);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*&,std::__cxx11::string>
                ((_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)&this->GlobalAutoGenTargets_,&localGen,&targetName);
      globalAutoGenTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET",(allocator<char> *)&uicExec);
    psVar9 = cmMakefile::GetSafeDefinition(this_00,&targetName);
    bVar4 = cmSystemTools::IsOn(psVar9);
    std::__cxx11::string::~string((string *)&targetName);
    if (bVar4) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&uicExec,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME",(allocator<char> *)&rccExec);
      psVar9 = cmMakefile::GetSafeDefinition(this_00,&uicExec);
      std::__cxx11::string::string((string *)&targetName,(string *)psVar9);
      std::__cxx11::string::~string((string *)&uicExec);
      if (targetName._M_string_length == 0) {
        std::__cxx11::string::assign((char *)&targetName);
      }
      std::
      _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
      ::_M_emplace_unique<cmLocalGenerator*&,std::__cxx11::string>
                ((_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
                  *)&this->GlobalAutoRccTargets_,&localGen,&targetName);
      globalAutoRccTarget = true;
      std::__cxx11::string::~string((string *)&targetName);
    }
    ppcVar3 = (localGen->GeneratorTargets).
              super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppcVar12 = (localGen->GeneratorTargets).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_start; ppcVar12 != ppcVar3;
        ppcVar12 = ppcVar12 + 1) {
      target = *ppcVar12;
      TVar8 = cmGeneratorTarget::GetType(target);
      if ((TVar8 < UTILITY) && (bVar4 = cmGeneratorTarget::IsImported(target), !bVar4)) {
        bVar4 = cmGeneratorTarget::GetPropertyAsBool(target,&(this->Keywords_).AUTOMOC);
        bVar5 = cmGeneratorTarget::GetPropertyAsBool(target,&(this->Keywords_).AUTOUIC);
        bVar6 = cmGeneratorTarget::GetPropertyAsBool(target,&(this->Keywords_).AUTORCC);
        if ((bVar4 || bVar5) || bVar6) {
          pcVar10 = cmGeneratorTarget::GetSafeProperty(target,&(this->Keywords_).AUTOMOC_EXECUTABLE)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&targetName,pcVar10,(allocator<char> *)&uicExec);
          pcVar10 = cmGeneratorTarget::GetSafeProperty(target,&(this->Keywords_).AUTOUIC_EXECUTABLE)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&uicExec,pcVar10,(allocator<char> *)&rccExec);
          pcVar10 = cmGeneratorTarget::GetSafeProperty(target,&(this->Keywords_).AUTORCC_EXECUTABLE)
          ;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&rccExec,pcVar10,(allocator<char> *)&msg);
          local_100 = cmQtAutoGenInitializer::GetQtVersion(target);
          bVar13 = local_100.first.Major - 4 < 3;
          bVar7 = bVar4 && (bVar13 || targetName._M_string_length != 0);
          uicIsValid = bVar5 && (bVar13 || uicExec._M_string_length != 0);
          rccIsValid = bVar6 && (bVar13 || rccExec._M_string_length != 0);
          bVar4 = (!bVar13 && targetName._M_string_length == 0) && bVar4;
          bVar5 = (!bVar13 && uicExec._M_string_length == 0) && bVar5;
          bVar6 = (!bVar13 && rccExec._M_string_length == 0) && bVar6;
          mocIsValid = bVar7;
          if (((bVar5) || (bVar4)) || (bVar6)) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&msg,"AUTOGEN: No valid Qt version found for target ",
                       (allocator<char> *)&version);
            cmGeneratorTarget::GetName_abi_cxx11_(target);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
            cmQtAutoGen::Tools_abi_cxx11_
                      (&version,(cmQtAutoGen *)(ulong)bVar4,bVar5,bVar6,SUB81(in_R8,0));
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::~string((string *)&version);
            std::__cxx11::string::append((char *)&msg);
            if (local_100.second == 0) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&version,"<QTVERSION>",(allocator<char> *)&comp);
            }
            else {
              std::__cxx11::to_string(&version,local_100.second);
            }
            pcVar10 = "Core";
            if (bVar5) {
              pcVar10 = "Widgets";
            }
            std::__cxx11::string::string<std::allocator<char>>((string *)&comp,pcVar10,&local_161);
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::append((string *)&msg);
            std::__cxx11::string::append((char *)&msg);
            std::__cxx11::string::~string((string *)&comp);
            std::__cxx11::string::~string((string *)&version);
            std::__cxx11::string::append((char *)&msg);
            cmMakefile::IssueMessage(target->Makefile,AUTHOR_WARNING,&msg);
            std::__cxx11::string::~string((string *)&msg);
            bVar7 = (bool)(mocIsValid & 1);
          }
          if (((bVar7 != false) || (uicIsValid != false)) || (rccIsValid == true)) {
            in_R8 = &mocIsValid;
            version._M_dataplus._M_p = (pointer)this;
            std::
            make_unique<cmQtAutoGenInitializer,cmQtAutoGenGlobalInitializer*,cmGeneratorTarget*&,cmQtAutoGen::IntegerVersion&,bool_const&,bool_const&,bool_const&,bool&,bool&>
                      ((cmQtAutoGenGlobalInitializer **)&msg,(cmGeneratorTarget **)&version,
                       (IntegerVersion *)&target,(bool *)&local_100,in_R8,&uicIsValid,&rccIsValid,
                       &globalAutoGenTarget);
            std::
            vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
            ::
            emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                      ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                        *)this,(unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                *)&msg);
            std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>::
            ~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                         *)&msg);
          }
          std::__cxx11::string::~string((string *)&rccExec);
          std::__cxx11::string::~string((string *)&uicExec);
          std::__cxx11::string::~string((string *)&targetName);
        }
      }
    }
    ppcVar11 = ppcVar11 + 1;
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<cmLocalGenerator*> const& localGenerators)
{
  for (cmLocalGenerator* localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        GlobalAutoGenTargets_.emplace(localGen, std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (cmSystemTools::IsOn(
            makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET"))) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        GlobalAutoRccTargets_.emplace(localGen, std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (cmGeneratorTarget* target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const mocExec =
          target->GetSafeProperty(kw().AUTOMOC_EXECUTABLE);
        std::string const uicExec =
          target->GetSafeProperty(kw().AUTOUIC_EXECUTABLE);
        std::string const rccExec =
          target->GetSafeProperty(kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto qtVersion = cmQtAutoGenInitializer::GetQtVersion(target);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          std::string msg = "AUTOGEN: No valid Qt version found for target ";
          msg += target->GetName();
          msg += ". ";
          msg += cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled);
          msg += " disabled.  Consider adding:\n";
          {
            std::string version = (qtVersion.second == 0)
              ? std::string("<QTVERSION>")
              : std::to_string(qtVersion.second);
            std::string comp = uicDisabled ? "Widgets" : "Core";
            msg += "  find_package(Qt";
            msg += version;
            msg += " COMPONENTS ";
            msg += comp;
            msg += ")\n";
          }
          msg += "to your CMakeLists.txt file.";
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          Initializers_.emplace_back(cm::make_unique<cmQtAutoGenInitializer>(
            this, target, qtVersion.first, mocIsValid, uicIsValid, rccIsValid,
            globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}